

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalMapping::MergeFrom
          (CategoricalMapping *this,CategoricalMapping *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  Int64ToStringMap *pIVar3;
  StringToInt64Map *pSVar4;
  Int64ToStringMap *from_00;
  StringToInt64Map *from_01;
  ValueOnUnknownUnion VVar5;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/CategoricalMapping.pb.cc"
               ,0x18a);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] == 1) {
    if (this->_oneof_case_[0] != 1) {
      clear_MappingType(this);
      this->_oneof_case_[0] = 1;
      pSVar4 = (StringToInt64Map *)operator_new(0x38);
      StringToInt64Map::StringToInt64Map(pSVar4);
      (this->MappingType_).stringtoint64map_ = pSVar4;
    }
    pSVar4 = (this->MappingType_).stringtoint64map_;
    if (from->_oneof_case_[0] == 1) {
      from_01 = (from->MappingType_).stringtoint64map_;
    }
    else {
      from_01 = StringToInt64Map::default_instance();
    }
    StringToInt64Map::MergeFrom(pSVar4,from_01);
  }
  else if (from->_oneof_case_[0] == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_MappingType(this);
      this->_oneof_case_[0] = 2;
      pIVar3 = (Int64ToStringMap *)operator_new(0x38);
      Int64ToStringMap::Int64ToStringMap(pIVar3);
      (this->MappingType_).int64tostringmap_ = pIVar3;
    }
    pIVar3 = (this->MappingType_).int64tostringmap_;
    if (from->_oneof_case_[0] == 2) {
      from_00 = (from->MappingType_).int64tostringmap_;
    }
    else {
      from_00 = Int64ToStringMap::default_instance();
    }
    Int64ToStringMap::MergeFrom(pIVar3,from_00);
  }
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0x66) {
    if (uVar1 == 0x66) {
      VVar5 = from->ValueOnUnknown_;
    }
    else {
      VVar5.int64value_ = 0;
    }
    if (this->_oneof_case_[1] != 0x66) {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x66;
    }
    this->ValueOnUnknown_ = VVar5;
  }
  else if (uVar1 == 0x65) {
    if (uVar1 != 0x65) {
      VVar5 = (ValueOnUnknownUnion)
              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    else {
      VVar5 = from->ValueOnUnknown_;
    }
    if (this->_oneof_case_[1] != 0x65) {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x65;
      this->ValueOnUnknown_ =
           (ValueOnUnknownUnion)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if ((string *)(this->ValueOnUnknown_).int64value_ ==
        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&(this->ValueOnUnknown_).strvalue_,(string *)VVar5);
    }
    else {
      std::__cxx11::string::_M_assign((string *)(this->ValueOnUnknown_).int64value_);
    }
  }
  return;
}

Assistant:

void CategoricalMapping::MergeFrom(const CategoricalMapping& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CategoricalMapping)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.MappingType_case()) {
    case kStringToInt64Map: {
      mutable_stringtoint64map()->::CoreML::Specification::StringToInt64Map::MergeFrom(from.stringtoint64map());
      break;
    }
    case kInt64ToStringMap: {
      mutable_int64tostringmap()->::CoreML::Specification::Int64ToStringMap::MergeFrom(from.int64tostringmap());
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  switch (from.ValueOnUnknown_case()) {
    case kStrValue: {
      set_strvalue(from.strvalue());
      break;
    }
    case kInt64Value: {
      set_int64value(from.int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
}